

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>::
find<kj::TreeMap<int,kj::StringPtr>::Entry,int&>
          (TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<int,_kj::StringPtr>::Entry> table,int *params)

{
  uint uVar1;
  ulong uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  int *in_R8;
  Maybe<unsigned_long> MVar4;
  Iterator iter;
  size_t local_60;
  int *local_58;
  Iterator local_50;
  SearchKey local_38;
  StringPtr *local_30;
  size_t *local_28;
  
  local_60 = table.size_;
  local_30 = table.ptr;
  local_28 = &local_60;
  local_38._vptr_SearchKey = (_func_char_7_ **)&PTR_search_0021c400;
  local_58 = params;
  _::BTreeImpl::search(&local_50,(BTreeImpl *)&(local_30->content).size_,&local_38);
  aVar3 = extraout_RDX;
  if (((ulong)local_50.row != 0xe) && (uVar1 = (local_50.leaf)->rows[local_50.row].i, uVar1 != 0)) {
    uVar2 = (ulong)(uVar1 - 1);
    aVar3.value = uVar2 * 0x18;
    if (*(int *)(local_60 + aVar3.value) == *in_R8) {
      *this = (TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>)0x1;
      *(ulong *)(this + 8) = uVar2;
      goto LAB_001708f7;
    }
  }
  *this = (TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>)0x0;
LAB_001708f7:
  MVar4.ptr.field_1.value = aVar3.value;
  MVar4.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar4.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    auto iter = impl.search(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return size_t(*iter);
    } else {
      return kj::none;
    }
  }